

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

Abc_TtStore_t * Abc_TruthStoreAlloc2(int nVars,int nFuncs,word *pBuffer)

{
  Abc_TtStore_t *pAVar1;
  word **ppwVar2;
  word *pwVar3;
  ulong uVar4;
  int iVar5;
  
  pAVar1 = (Abc_TtStore_t *)malloc(0x18);
  pAVar1->nVars = nVars;
  iVar5 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar5 = 1;
  }
  pAVar1->nWords = iVar5;
  pAVar1->nFuncs = nFuncs;
  ppwVar2 = (word **)malloc((long)nFuncs * 8);
  pAVar1->pFuncs = ppwVar2;
  *ppwVar2 = pBuffer;
  if (1 < nFuncs) {
    pwVar3 = *ppwVar2;
    uVar4 = 1;
    do {
      pwVar3 = pwVar3 + iVar5;
      ppwVar2[uVar4] = pwVar3;
      uVar4 = uVar4 + 1;
    } while ((uint)nFuncs != uVar4);
  }
  return pAVar1;
}

Assistant:

Abc_TtStore_t * Abc_TruthStoreAlloc2( int nVars, int nFuncs, word * pBuffer )
{
    Abc_TtStore_t * p;
    int i;
    p = (Abc_TtStore_t *)malloc( sizeof(Abc_TtStore_t) );
    p->nVars  =  nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars-6));
    p->nFuncs =  nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **)malloc( sizeof(word *) * p->nFuncs );
    // assign and clean the truth table storage
    p->pFuncs[0] = pBuffer;
    // split it up into individual truth tables
    for ( i = 1; i < p->nFuncs; i++ )
        p->pFuncs[i] = p->pFuncs[i-1] + p->nWords;
    return p;
}